

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlCharacters(xmlParserCtxtPtr ctxt,xmlChar *buf,int size)

{
  xmlChar xVar1;
  _xmlSAXHandler *p_Var2;
  charactersSAXFunc p_Var3;
  xmlDocPtr pxVar4;
  xmlNode *node;
  ignorableWhitespaceSAXFunc UNRECOVERED_JUMPTABLE;
  int iVar5;
  void *pvVar6;
  xmlNodePtr pxVar7;
  xmlDocPtr doc;
  xmlChar *pxVar8;
  
  p_Var2 = ctxt->sax;
  if (p_Var2 == (_xmlSAXHandler *)0x0) {
    return;
  }
  if (ctxt->disableSAX != 0) {
    return;
  }
  if (((((ctxt->keepBlanks == 0) && (p_Var2->ignorableWhitespace != p_Var2->characters)) &&
       (ctxt->space != (int *)0x0)) && ((iVar5 = *ctxt->space, iVar5 != -2 && (iVar5 != 1)))) &&
     (pxVar7 = ctxt->node, pxVar7 != (xmlNodePtr)0x0)) {
    pxVar4 = ctxt->myDoc;
    if (pxVar4 != (xmlDocPtr)0x0) {
      if (pxVar7->ns == (xmlNs *)0x0) {
        pxVar8 = (xmlChar *)0x0;
      }
      else {
        pxVar8 = pxVar7->ns->prefix;
      }
      if (((pxVar4->intSubset != (_xmlDtd *)0x0) &&
          (pvVar6 = xmlHashLookup2((xmlHashTablePtr)pxVar4->intSubset->elements,pxVar7->name,pxVar8)
          , pvVar6 != (void *)0x0)) ||
         ((pxVar4->extSubset != (_xmlDtd *)0x0 &&
          (pvVar6 = xmlHashLookup2((xmlHashTablePtr)pxVar4->extSubset->elements,ctxt->node->name,
                                   pxVar8), pvVar6 != (void *)0x0)))) {
        if (*(int *)((long)pvVar6 + 0x48) - 2U < 2) goto LAB_001424fd;
        if (*(int *)((long)pvVar6 + 0x48) == 4) goto LAB_0014265b;
      }
    }
    pxVar8 = ctxt->input->cur;
    xVar1 = *pxVar8;
    if (((xVar1 == '<') || (xVar1 == '\r')) &&
       ((xVar1 != '<' || ((ctxt->node->children != (_xmlNode *)0x0 || (pxVar8[1] != '/')))))) {
      pxVar7 = xmlGetLastChild(ctxt->node);
      if (pxVar7 == (xmlNodePtr)0x0) {
        if ((ctxt->node->type == XML_ELEMENT_NODE) || (ctxt->node->content == (xmlChar *)0x0))
        goto LAB_0014265b;
      }
      else {
        iVar5 = xmlNodeIsText(pxVar7);
        if ((iVar5 == 0) &&
           ((node = ctxt->node->children, node == (xmlNode *)0x0 ||
            (iVar5 = xmlNodeIsText(node), iVar5 == 0)))) {
LAB_0014265b:
          UNRECOVERED_JUMPTABLE = ctxt->sax->ignorableWhitespace;
          if (UNRECOVERED_JUMPTABLE == (ignorableWhitespaceSAXFunc)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)(ctxt->userData,buf,size);
          return;
        }
      }
    }
  }
LAB_001424fd:
  p_Var3 = ctxt->sax->characters;
  if (p_Var3 != (charactersSAXFunc)0x0) {
    (*p_Var3)(ctxt->userData,buf,size);
  }
  if ((ctxt->keepBlanks == 0) && (*ctxt->space == -1)) {
    *ctxt->space = -2;
  }
  return;
}

Assistant:

static void
xmlCharacters(xmlParserCtxtPtr ctxt, const xmlChar *buf, int size) {
    if ((ctxt->sax == NULL) || (ctxt->disableSAX))
        return;

    /*
     * Calling areBlanks with only parts of a text node
     * is fundamentally broken, making the NOBLANKS option
     * essentially unusable.
     */
    if ((!ctxt->keepBlanks) &&
        (ctxt->sax->ignorableWhitespace != ctxt->sax->characters) &&
        (areBlanks(ctxt, buf, size, 1))) {
        if (ctxt->sax->ignorableWhitespace != NULL)
            ctxt->sax->ignorableWhitespace(ctxt->userData, buf, size);
    } else {
        if (ctxt->sax->characters != NULL)
            ctxt->sax->characters(ctxt->userData, buf, size);

        /*
         * The old code used to update this value for "complex" data
         * even if keepBlanks was true. This was probably a bug.
         */
        if ((!ctxt->keepBlanks) && (*ctxt->space == -1))
            *ctxt->space = -2;
    }
}